

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::ArrayBuilder<kj::String>::removeLast(ArrayBuilder<kj::String> *this)

{
  RemoveConst<kj::String> *pRVar1;
  
  pRVar1 = this->pos;
  this->pos = (RemoveConst<kj::String> *)&pRVar1[-1].content;
  Array<char>::~Array(&pRVar1[-1].content);
  return;
}

Assistant:

void removeLast() {
    KJ_IREQUIRE(pos > ptr, "No elements present to remove.");
    kj::dtor(*--pos);
  }